

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyn_tbl.cpp
# Opt level: O0

dyn_tbl_t * dyn_tbl_init(uint length,int lgn,longlong T)

{
  dyn_tbl_t *__s;
  longlong in_RDX;
  uint in_ESI;
  uint in_EDI;
  dyn_tbl_t *ret;
  
  __s = (dyn_tbl_t *)operator_new(0x60);
  memset(__s,0,0x60);
  dyn_tbl_s::dyn_tbl_s((dyn_tbl_s *)0x104419);
  __s->lgn = in_ESI;
  __s->max_len = in_EDI;
  __s->decrement = 0;
  __s->total = 0;
  __s->T = in_RDX;
  __s->max_value = 0;
  return __s;
}

Assistant:

dyn_tbl_t* dyn_tbl_init(unsigned int length, int lgn, long long T) {
	dyn_tbl_t* ret = new dyn_tbl_t();
	ret->lgn = lgn;
	ret->max_len = length;
	ret->decrement = 0;
	ret->total = 0;
	ret->T = T;
	ret->max_value = 0;
	return ret;
}